

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

unique_ptr<argo::json,_std::default_delete<argo::json>_> __thiscall
argo::parser::parse_value(parser *this,lexer *l,size_t nesting_depth)

{
  token_type tVar1;
  json *pjVar2;
  json_parser_exception *this_00;
  string *psVar3;
  size_t byte_index;
  json_utf8_exception *e;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48 [3];
  token *local_30;
  token *t;
  size_t nesting_depth_local;
  lexer *l_local;
  parser *this_local;
  
  nesting_depth_local = nesting_depth;
  l_local = l;
  this_local = this;
  local_30 = lexer::next((lexer *)nesting_depth);
  tVar1 = token::get_type(local_30);
  switch(tVar1) {
  case begin_array_e:
    parse_array(this,l,nesting_depth_local);
    break;
  case begin_object_e:
    parse_object(this,l,nesting_depth_local);
    break;
  default:
    this_00 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
    psVar3 = token::get_raw_value_abi_cxx11_(local_30);
    byte_index = reader::get_byte_index((reader *)l->_vptr_lexer);
    json_parser_exception::json_parser_exception(this_00,unexpected_token_e,psVar3,byte_index);
    __cxa_throw(this_00,&json_parser_exception::typeinfo,
                json_parser_exception::~json_parser_exception);
  case number_int_e:
    if (((byte)(l->m_token).m_raw_value & 1) == 0) {
      pjVar2 = (json *)operator_new(0x58);
      psVar3 = token::get_raw_value_abi_cxx11_(local_30);
      json::json(pjVar2,number_int_e,psVar3);
      std::unique_ptr<argo::json,std::default_delete<argo::json>>::
      unique_ptr<std::default_delete<argo::json>,void>
                ((unique_ptr<argo::json,std::default_delete<argo::json>> *)this,pjVar2);
    }
    else {
      parse_number_int(this,(token *)l);
    }
    break;
  case number_double_e:
    if (((byte)(l->m_token).m_raw_value & 1) == 0) {
      pjVar2 = (json *)operator_new(0x58);
      psVar3 = token::get_raw_value_abi_cxx11_(local_30);
      json::json(pjVar2,number_double_e,psVar3);
      std::unique_ptr<argo::json,std::default_delete<argo::json>>::
      unique_ptr<std::default_delete<argo::json>,void>
                ((unique_ptr<argo::json,std::default_delete<argo::json>> *)this,pjVar2);
    }
    else {
      parse_number_double(this,(token *)l);
    }
    break;
  case string_e:
    if (((l->m_token).field_0xa & 1) == 0) {
      pjVar2 = (json *)operator_new(0x58);
      psVar3 = token::get_raw_value_abi_cxx11_(local_30);
      json::json(pjVar2,string_e,psVar3);
      std::unique_ptr<argo::json,std::default_delete<argo::json>>::
      unique_ptr<std::default_delete<argo::json>,void>
                ((unique_ptr<argo::json,std::default_delete<argo::json>> *)this,pjVar2);
    }
    else {
      pjVar2 = (json *)operator_new(0x58);
      psVar3 = token::get_raw_value_abi_cxx11_(local_30);
      utf8::json_string_to_utf8((utf8 *)local_48,psVar3);
      json::json(pjVar2,local_48);
      std::unique_ptr<argo::json,std::default_delete<argo::json>>::
      unique_ptr<std::default_delete<argo::json>,void>
                ((unique_ptr<argo::json,std::default_delete<argo::json>> *)this,pjVar2);
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(local_48);
    }
    break;
  case false_e:
    pjVar2 = (json *)operator_new(0x58);
    json::json(pjVar2,false);
    std::unique_ptr<argo::json,std::default_delete<argo::json>>::
    unique_ptr<std::default_delete<argo::json>,void>
              ((unique_ptr<argo::json,std::default_delete<argo::json>> *)this,pjVar2);
    break;
  case true_e:
    pjVar2 = (json *)operator_new(0x58);
    json::json(pjVar2,true);
    std::unique_ptr<argo::json,std::default_delete<argo::json>>::
    unique_ptr<std::default_delete<argo::json>,void>
              ((unique_ptr<argo::json,std::default_delete<argo::json>> *)this,pjVar2);
    break;
  case null_e:
    pjVar2 = (json *)operator_new(0x58);
    json::json(pjVar2);
    std::unique_ptr<argo::json,std::default_delete<argo::json>>::
    unique_ptr<std::default_delete<argo::json>,void>
              ((unique_ptr<argo::json,std::default_delete<argo::json>> *)this,pjVar2);
  }
  return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
         (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
}

Assistant:

unique_ptr<json> parser::parse_value(lexer &l, size_t nesting_depth)
{
    const token &t = l.next();

    switch (t.get_type())
    {
    case token::begin_object_e:
        return parse_object(l, nesting_depth + 1);
    case token::begin_array_e:
        return parse_array(l, nesting_depth + 1);
    case token::number_int_e:
        if (m_convert_numbers)
        {
            return parse_number_int(t);
        }
        else
        {
            return unique_ptr<json>(new json(json::number_int_e, t.get_raw_value()));
        }
    case token::number_double_e:
        if (m_convert_numbers)
        {
            return parse_number_double(t);
        }
        else
        {
            return unique_ptr<json>(new json(json::number_double_e, t.get_raw_value()));
        }
    case token::string_e:
        if (m_convert_strings)
        {
            try
            {
                return unique_ptr<json>(new json(utf8::json_string_to_utf8(t.get_raw_value())));
            }
            catch (json_utf8_exception &e)
            {
                e.add_byte_index(m_reader.get_byte_index());
                throw e;
            }
        }
        else
        {
            return unique_ptr<json>(new json(json::string_e, t.get_raw_value()));
        }
    case token::false_e:
        return unique_ptr<json>(new json(false));
    case token::true_e:
        return unique_ptr<json>(new json(true));
    case token::null_e:
        return unique_ptr<json>(new json);
    default:
        throw json_parser_exception(
                            json_parser_exception::unexpected_token_e,
                            t.get_raw_value(),
                            m_reader.get_byte_index());
    }
}